

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O0

int SUNPCGSetPrecType(SUNLinearSolver S,int pretype)

{
  int iVar1;
  int pretype_local;
  SUNLinearSolver S_local;
  
  iVar1 = SUNLinSol_PCGSetPrecType(S,pretype);
  return iVar1;
}

Assistant:

int SUNPCGSetPrecType(SUNLinearSolver S, int pretype)
{ return(SUNLinSol_PCGSetPrecType(S, pretype)); }